

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *functionBody)

{
  Type *addr;
  Type *addr_00;
  Recycler *pRVar1;
  
  (this->selfInfo).polymorphicInlineCaches.inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->selfInfo).polymorphicInlineCaches.inlineCacheCount = 0;
  (this->selfInfo).polymorphicCacheUtilizationArray.utilArray.ptr = (uchar *)0x0;
  addr = &(this->selfInfo).functionBody;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->selfInfo).functionBody.ptr = functionBody;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  addr_00 = &this->inlineeInfo;
  pRVar1 = ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
           recycler;
  (this->inlineeInfo).super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  super_SListNodeBase<Memory::Recycler>.next.ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  (this->inlineeInfo).super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.super_RealCount.
  count = 0;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (this->inlineeInfo).super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  super_SListNodeBase<Memory::Recycler>.next.ptr = (SListNodeBase<Memory::Recycler> *)addr_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  (this->inlineeInfo).super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.super_RealCount.
  count = 0;
  (this->inlineeInfo).super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  allocator = pRVar1;
  return;
}

Assistant:

EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo(FunctionBody * functionBody) :
        selfInfo(functionBody),
        inlineeInfo(functionBody->GetRecycler())
    {
    }